

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

void __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::rehash(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
         *this,uint new_hash_size)

{
  raw_node *prVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint32 uVar32;
  uint uVar33;
  uint8 *puVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  raw_node *prVar39;
  raw_node *prVar40;
  uint uVar41;
  uint uVar42;
  raw_node *p;
  byte bVar43;
  undefined4 uVar44;
  undefined4 uVar46;
  undefined1 auVar45 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  int iVar69;
  int iVar70;
  undefined1 auVar67 [16];
  int iVar71;
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  elemental_vector local_48;
  uint local_38;
  undefined8 local_30;
  
  bVar43 = 0;
  if ((this->m_num_valid <= new_hash_size) && ((this->m_values).m_size != new_hash_size)) {
    local_48.m_p = (void *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_38 = 0x20;
    local_30 = 0;
    uVar42 = 0x20;
    if (new_hash_size == 0) {
      prVar40 = (raw_node *)0x0;
    }
    else {
      elemental_vector::increase_capacity
                (&local_48,new_hash_size,new_hash_size == 1,0x48,
                 vector<crnlib::hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>::raw_node>
                 ::object_mover,false);
      auVar31 = _DAT_001a70c0;
      auVar30 = _DAT_001a70b0;
      auVar29 = _DAT_001a70a0;
      auVar28 = _DAT_001a7090;
      auVar27 = _DAT_001a7080;
      auVar26 = _DAT_001a7020;
      auVar25 = _DAT_001a7010;
      if (new_hash_size - local_48.m_size != 0) {
        uVar35 = (ulong)(new_hash_size - local_48.m_size) * 0x48 - 0x48;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uVar35;
        uVar44 = SUB164(auVar67 * ZEXT816(0xe38e38e38e38e38f),8);
        uVar46 = (undefined4)(uVar35 / 0x120000000);
        auVar72._0_8_ = CONCAT44(uVar46,uVar44);
        auVar72._8_4_ = uVar44;
        auVar72._12_4_ = uVar46;
        auVar45._0_8_ = auVar72._0_8_ >> 6;
        auVar45._8_8_ = auVar72._8_8_ >> 6;
        puVar34 = ((raw_node *)((long)local_48.m_p + ((ulong)local_48.m_size + 0xf) * 0x48))->m_bits
                  + 0x44;
        uVar36 = 0;
        do {
          auVar64._8_4_ = (int)uVar36;
          auVar64._0_8_ = uVar36;
          auVar64._12_4_ = (int)(uVar36 >> 0x20);
          auVar67 = auVar45 ^ auVar26;
          auVar72 = (auVar64 | auVar25) ^ auVar26;
          iVar66 = auVar67._0_4_;
          iVar85 = -(uint)(iVar66 < auVar72._0_4_);
          iVar69 = auVar67._4_4_;
          auVar74._4_4_ = -(uint)(iVar69 < auVar72._4_4_);
          iVar70 = auVar67._8_4_;
          iVar89 = -(uint)(iVar70 < auVar72._8_4_);
          iVar71 = auVar67._12_4_;
          auVar74._12_4_ = -(uint)(iVar71 < auVar72._12_4_);
          auVar56._4_4_ = iVar85;
          auVar56._0_4_ = iVar85;
          auVar56._8_4_ = iVar89;
          auVar56._12_4_ = iVar89;
          auVar67 = pshuflw(in_XMM1,auVar56,0xe8);
          auVar73._4_4_ = -(uint)(auVar72._4_4_ == iVar69);
          auVar73._12_4_ = -(uint)(auVar72._12_4_ == iVar71);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar56 = pshuflw(in_XMM2,auVar73,0xe8);
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar72 = pshuflw(auVar67,auVar74,0xe8);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar72 | auVar56 & auVar67) ^ auVar47;
          auVar67 = packssdw(auVar47,auVar47);
          if ((auVar67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar34[-0x438] = 0;
          }
          auVar12._4_4_ = iVar85;
          auVar12._0_4_ = iVar85;
          auVar12._8_4_ = iVar89;
          auVar12._12_4_ = iVar89;
          auVar74 = auVar73 & auVar12 | auVar74;
          auVar67 = packssdw(auVar74,auVar74);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar2,auVar67 ^ auVar2);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._0_4_ >> 8 & 1) != 0) {
            puVar34[-0x3f0] = 0;
          }
          auVar67 = (auVar64 | auVar31) ^ auVar26;
          auVar57._0_4_ = -(uint)(iVar66 < auVar67._0_4_);
          auVar57._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar57._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar57._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar75._4_4_ = auVar57._0_4_;
          auVar75._0_4_ = auVar57._0_4_;
          auVar75._8_4_ = auVar57._8_4_;
          auVar75._12_4_ = auVar57._8_4_;
          iVar85 = -(uint)(auVar67._4_4_ == iVar69);
          iVar89 = -(uint)(auVar67._12_4_ == iVar71);
          auVar13._4_4_ = iVar85;
          auVar13._0_4_ = iVar85;
          auVar13._8_4_ = iVar89;
          auVar13._12_4_ = iVar89;
          auVar86._4_4_ = auVar57._4_4_;
          auVar86._0_4_ = auVar57._4_4_;
          auVar86._8_4_ = auVar57._12_4_;
          auVar86._12_4_ = auVar57._12_4_;
          auVar67 = auVar13 & auVar75 | auVar86;
          auVar67 = packssdw(auVar67,auVar67);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar3,auVar67 ^ auVar3);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._0_4_ >> 0x10 & 1) != 0) {
            puVar34[-0x3a8] = 0;
          }
          auVar67 = pshufhw(auVar67,auVar75,0x84);
          auVar14._4_4_ = iVar85;
          auVar14._0_4_ = iVar85;
          auVar14._8_4_ = iVar89;
          auVar14._12_4_ = iVar89;
          auVar47 = pshufhw(auVar57,auVar14,0x84);
          auVar72 = pshufhw(auVar67,auVar86,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar72 | auVar47 & auVar67) ^ auVar48;
          auVar67 = packssdw(auVar48,auVar48);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._0_4_ >> 0x18 & 1) != 0) {
            puVar34[-0x360] = 0;
          }
          auVar67 = (auVar64 | auVar30) ^ auVar26;
          auVar58._0_4_ = -(uint)(iVar66 < auVar67._0_4_);
          auVar58._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar58._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar58._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar15._4_4_ = auVar58._0_4_;
          auVar15._0_4_ = auVar58._0_4_;
          auVar15._8_4_ = auVar58._8_4_;
          auVar15._12_4_ = auVar58._8_4_;
          auVar47 = pshuflw(auVar86,auVar15,0xe8);
          auVar49._0_4_ = -(uint)(auVar67._0_4_ == iVar66);
          auVar49._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar49._8_4_ = -(uint)(auVar67._8_4_ == iVar70);
          auVar49._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar76._4_4_ = auVar49._4_4_;
          auVar76._0_4_ = auVar49._4_4_;
          auVar76._8_4_ = auVar49._12_4_;
          auVar76._12_4_ = auVar49._12_4_;
          auVar67 = pshuflw(auVar49,auVar76,0xe8);
          auVar77._4_4_ = auVar58._4_4_;
          auVar77._0_4_ = auVar58._4_4_;
          auVar77._8_4_ = auVar58._12_4_;
          auVar77._12_4_ = auVar58._12_4_;
          auVar72 = pshuflw(auVar58,auVar77,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 & auVar47,(auVar72 | auVar67 & auVar47) ^ auVar4);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar34[-0x318] = 0;
          }
          auVar16._4_4_ = auVar58._0_4_;
          auVar16._0_4_ = auVar58._0_4_;
          auVar16._8_4_ = auVar58._8_4_;
          auVar16._12_4_ = auVar58._8_4_;
          auVar77 = auVar76 & auVar16 | auVar77;
          auVar72 = packssdw(auVar77,auVar77);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67,auVar72 ^ auVar5);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._4_2_ >> 8 & 1) != 0) {
            puVar34[-0x2d0] = 0;
          }
          auVar67 = (auVar64 | auVar29) ^ auVar26;
          auVar59._0_4_ = -(uint)(iVar66 < auVar67._0_4_);
          auVar59._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar59._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar59._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar78._4_4_ = auVar59._0_4_;
          auVar78._0_4_ = auVar59._0_4_;
          auVar78._8_4_ = auVar59._8_4_;
          auVar78._12_4_ = auVar59._8_4_;
          iVar85 = -(uint)(auVar67._4_4_ == iVar69);
          iVar89 = -(uint)(auVar67._12_4_ == iVar71);
          auVar17._4_4_ = iVar85;
          auVar17._0_4_ = iVar85;
          auVar17._8_4_ = iVar89;
          auVar17._12_4_ = iVar89;
          auVar87._4_4_ = auVar59._4_4_;
          auVar87._0_4_ = auVar59._4_4_;
          auVar87._8_4_ = auVar59._12_4_;
          auVar87._12_4_ = auVar59._12_4_;
          auVar67 = auVar17 & auVar78 | auVar87;
          auVar67 = packssdw(auVar67,auVar67);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar6,auVar67 ^ auVar6);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar34[-0x288] = 0;
          }
          auVar67 = pshufhw(auVar67,auVar78,0x84);
          auVar18._4_4_ = iVar85;
          auVar18._0_4_ = iVar85;
          auVar18._8_4_ = iVar89;
          auVar18._12_4_ = iVar89;
          auVar47 = pshufhw(auVar59,auVar18,0x84);
          auVar72 = pshufhw(auVar67,auVar87,0x84);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar72 | auVar47 & auVar67) ^ auVar50;
          auVar67 = packssdw(auVar50,auVar50);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._6_2_ >> 8 & 1) != 0) {
            puVar34[-0x240] = 0;
          }
          auVar67 = (auVar64 | auVar28) ^ auVar26;
          auVar60._0_4_ = -(uint)(iVar66 < auVar67._0_4_);
          auVar60._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar60._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar60._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar19._4_4_ = auVar60._0_4_;
          auVar19._0_4_ = auVar60._0_4_;
          auVar19._8_4_ = auVar60._8_4_;
          auVar19._12_4_ = auVar60._8_4_;
          auVar47 = pshuflw(auVar87,auVar19,0xe8);
          auVar51._0_4_ = -(uint)(auVar67._0_4_ == iVar66);
          auVar51._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar51._8_4_ = -(uint)(auVar67._8_4_ == iVar70);
          auVar51._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar79._4_4_ = auVar51._4_4_;
          auVar79._0_4_ = auVar51._4_4_;
          auVar79._8_4_ = auVar51._12_4_;
          auVar79._12_4_ = auVar51._12_4_;
          auVar67 = pshuflw(auVar51,auVar79,0xe8);
          auVar80._4_4_ = auVar60._4_4_;
          auVar80._0_4_ = auVar60._4_4_;
          auVar80._8_4_ = auVar60._12_4_;
          auVar80._12_4_ = auVar60._12_4_;
          auVar72 = pshuflw(auVar60,auVar80,0xe8);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar61 = (auVar72 | auVar67 & auVar47) ^ auVar61;
          auVar72 = packssdw(auVar61,auVar61);
          auVar67 = packsswb(auVar67 & auVar47,auVar72);
          if ((auVar67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar34[-0x1f8] = 0;
          }
          auVar20._4_4_ = auVar60._0_4_;
          auVar20._0_4_ = auVar60._0_4_;
          auVar20._8_4_ = auVar60._8_4_;
          auVar20._12_4_ = auVar60._8_4_;
          auVar80 = auVar79 & auVar20 | auVar80;
          auVar72 = packssdw(auVar80,auVar80);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar72 = packssdw(auVar72 ^ auVar7,auVar72 ^ auVar7);
          auVar67 = packsswb(auVar67,auVar72);
          if ((auVar67._8_2_ >> 8 & 1) != 0) {
            puVar34[-0x1b0] = 0;
          }
          auVar67 = (auVar64 | auVar27) ^ auVar26;
          auVar62._0_4_ = -(uint)(iVar66 < auVar67._0_4_);
          auVar62._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar62._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar62._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar81._4_4_ = auVar62._0_4_;
          auVar81._0_4_ = auVar62._0_4_;
          auVar81._8_4_ = auVar62._8_4_;
          auVar81._12_4_ = auVar62._8_4_;
          iVar85 = -(uint)(auVar67._4_4_ == iVar69);
          iVar89 = -(uint)(auVar67._12_4_ == iVar71);
          auVar21._4_4_ = iVar85;
          auVar21._0_4_ = iVar85;
          auVar21._8_4_ = iVar89;
          auVar21._12_4_ = iVar89;
          auVar88._4_4_ = auVar62._4_4_;
          auVar88._0_4_ = auVar62._4_4_;
          auVar88._8_4_ = auVar62._12_4_;
          auVar88._12_4_ = auVar62._12_4_;
          auVar67 = auVar21 & auVar81 | auVar88;
          auVar67 = packssdw(auVar67,auVar67);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar8,auVar67 ^ auVar8);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar34[-0x168] = 0;
          }
          auVar67 = pshufhw(auVar67,auVar81,0x84);
          auVar22._4_4_ = iVar85;
          auVar22._0_4_ = iVar85;
          auVar22._8_4_ = iVar89;
          auVar22._12_4_ = iVar89;
          auVar47 = pshufhw(auVar62,auVar22,0x84);
          auVar72 = pshufhw(auVar67,auVar88,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar72 | auVar47 & auVar67) ^ auVar52;
          auVar67 = packssdw(auVar52,auVar52);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._10_2_ >> 8 & 1) != 0) {
            puVar34[-0x120] = 0;
          }
          auVar67 = (auVar64 | _DAT_001a7070) ^ auVar26;
          auVar63._0_4_ = -(uint)(iVar66 < auVar67._0_4_);
          auVar63._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar63._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar63._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar23._4_4_ = auVar63._0_4_;
          auVar23._0_4_ = auVar63._0_4_;
          auVar23._8_4_ = auVar63._8_4_;
          auVar23._12_4_ = auVar63._8_4_;
          auVar47 = pshuflw(auVar88,auVar23,0xe8);
          auVar53._0_4_ = -(uint)(auVar67._0_4_ == iVar66);
          auVar53._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar53._8_4_ = -(uint)(auVar67._8_4_ == iVar70);
          auVar53._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar82._4_4_ = auVar53._4_4_;
          auVar82._0_4_ = auVar53._4_4_;
          auVar82._8_4_ = auVar53._12_4_;
          auVar82._12_4_ = auVar53._12_4_;
          auVar67 = pshuflw(auVar53,auVar82,0xe8);
          auVar83._4_4_ = auVar63._4_4_;
          auVar83._0_4_ = auVar63._4_4_;
          auVar83._8_4_ = auVar63._12_4_;
          auVar83._12_4_ = auVar63._12_4_;
          auVar72 = pshuflw(auVar63,auVar83,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 & auVar47,(auVar72 | auVar67 & auVar47) ^ auVar9);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar34[-0xd8] = 0;
          }
          auVar24._4_4_ = auVar63._0_4_;
          auVar24._0_4_ = auVar63._0_4_;
          auVar24._8_4_ = auVar63._8_4_;
          auVar24._12_4_ = auVar63._8_4_;
          auVar83 = auVar82 & auVar24 | auVar83;
          auVar72 = packssdw(auVar83,auVar83);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67,auVar72 ^ auVar10);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._12_2_ >> 8 & 1) != 0) {
            puVar34[-0x90] = 0;
          }
          auVar67 = (auVar64 | _DAT_001a7060) ^ auVar26;
          auVar54._0_4_ = -(uint)(iVar66 < auVar67._0_4_);
          auVar54._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar54._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar54._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar84._4_4_ = auVar54._0_4_;
          auVar84._0_4_ = auVar54._0_4_;
          auVar84._8_4_ = auVar54._8_4_;
          auVar84._12_4_ = auVar54._8_4_;
          auVar65._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar65._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar65._0_4_ = auVar65._4_4_;
          auVar65._8_4_ = auVar65._12_4_;
          auVar68._4_4_ = auVar54._4_4_;
          auVar68._0_4_ = auVar54._4_4_;
          auVar68._8_4_ = auVar54._12_4_;
          auVar68._12_4_ = auVar54._12_4_;
          auVar72 = auVar65 & auVar84 | auVar68;
          auVar67 = packssdw(auVar54,auVar72);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar11,auVar67 ^ auVar11);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar34[-0x48] = 0;
          }
          auVar67 = pshufhw(auVar67,auVar84,0x84);
          in_XMM2 = pshufhw(auVar72,auVar65,0x84);
          in_XMM2 = in_XMM2 & auVar67;
          auVar67 = pshufhw(auVar67,auVar68,0x84);
          auVar55._8_4_ = 0xffffffff;
          auVar55._0_8_ = 0xffffffffffffffff;
          auVar55._12_4_ = 0xffffffff;
          auVar55 = (auVar67 | in_XMM2) ^ auVar55;
          auVar67 = packssdw(auVar55,auVar55);
          in_XMM1 = packsswb(auVar67,auVar67);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar34 = '\0';
          }
          uVar36 = uVar36 + 0x10;
          puVar34 = puVar34 + 0x480;
        } while ((uVar35 / 0x48 + 0x10 & 0xfffffffffffffff0) != uVar36);
      }
      local_48.m_size = new_hash_size;
      prVar40 = (raw_node *)local_48.m_p;
      if (new_hash_size != 1) {
        uVar42 = 0x20;
        uVar35 = (ulong)new_hash_size;
        do {
          uVar42 = uVar42 - 1;
          uVar33 = (uint)uVar35;
          uVar35 = uVar35 >> 1;
        } while (3 < uVar33);
      }
    }
    local_30._4_4_ = 0xffffffff;
    p = (this->m_values).m_p;
    uVar35 = (ulong)(this->m_values).m_size;
    local_38 = uVar42;
    if (uVar35 != 0) {
      prVar1 = p + uVar35;
      do {
        if (p->m_bits[0x44] != '\0') {
          uVar32 = fast_hash(p,0x40);
          uVar33 = uVar32 * -0x61c88647 >> ((byte)local_38 & 0x1f);
          prVar40 = (raw_node *)((long)local_48.m_p + (ulong)uVar33 * 0x48);
          if (prVar40->m_bits[0x44] != '\0') {
            uVar41 = uVar33;
            do {
              uVar38 = uVar41 - 1;
              if (uVar41 == 0) {
                uVar38 = local_48.m_size - 1;
              }
              if (uVar38 == uVar33) goto LAB_00189c1c;
              prVar40 = prVar40 + -1;
              if (uVar41 == 0) {
                prVar40 = (raw_node *)((long)local_48.m_p + (ulong)(local_48.m_size - 1) * 0x48);
              }
              uVar41 = uVar38;
            } while (prVar40->m_bits[0x44] != '\0');
          }
          prVar39 = p;
          for (lVar37 = 0x12; lVar37 != 0; lVar37 = lVar37 + -1) {
            *(undefined4 *)prVar40->m_bits = *(undefined4 *)prVar39->m_bits;
            prVar39 = (raw_node *)((long)prVar39 + ((ulong)bVar43 * -2 + 1) * 4);
            prVar40 = (raw_node *)((long)prVar40 + ((ulong)bVar43 * -2 + 1) * 4);
          }
          p->m_bits[0x44] = '\0';
          local_30._0_4_ = (uint)local_30 + 1;
LAB_00189c1c:
          prVar40 = (raw_node *)local_48.m_p;
          uVar42 = local_38;
          if ((uint)local_30 == this->m_num_valid) break;
        }
        p = p + 1;
      } while (p != prVar1);
      p = (this->m_values).m_p;
    }
    local_30._4_4_ = new_hash_size + 1 >> 1;
    if (p != (raw_node *)0x0) {
      crnlib_free(p);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
      prVar40 = (raw_node *)local_48.m_p;
      uVar42 = local_38;
    }
    (this->m_values).m_p = prVar40;
    (this->m_values).m_size = local_48.m_size;
    (this->m_values).m_capacity = local_48.m_capacity;
    this->m_hash_shift = uVar42;
    this->m_num_valid = (uint)local_30;
    this->m_grow_threshold = local_30._4_4_;
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }